

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void memXor2(void *dest,void *src,size_t count)

{
  size_t count_local;
  void *src_local;
  void *dest_local;
  
  src_local = src;
  dest_local = dest;
  for (count_local = count; 7 < count_local; count_local = count_local - 8) {
    *(ulong *)dest_local = *src_local ^ *dest_local;
    src_local = (void *)((long)src_local + 8);
    dest_local = (void *)((long)dest_local + 8);
  }
  while (count_local != 0) {
    *(byte *)dest_local = *dest_local ^ *src_local;
    src_local = (void *)((long)src_local + 1);
    dest_local = (void *)((long)dest_local + 1);
    count_local = count_local - 1;
  }
  return;
}

Assistant:

void memXor2(void* dest, const void* src, size_t count)
{
	ASSERT(memIsSameOrDisjoint(src, dest, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		*(word*)dest ^= *(const word*)src;
		src = (const word*)src + 1;
		dest = (word*)dest + 1;
	}
	while (count--)
	{
		*(octet*)dest ^= *(const octet*)src;
		src = (const octet*)src + 1;
		dest = (octet*)dest + 1;
	}
}